

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_compressBegin_usingDict_deprecated
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,int compressionLevel)

{
  size_t sVar1;
  int compressionLevel_00;
  ZSTD_parameters params;
  ZSTD_CCtx_params cctxParams;
  
  ZSTD_getCParams_internal
            (&params.cParams,compressionLevel,0xffffffffffffffff,dictSize,ZSTD_cpm_noAttachDict);
  params.fParams.checksumFlag = 0;
  params.fParams.noDictIDFlag = 0;
  params.fParams.contentSizeFlag = 1;
  compressionLevel_00 = 3;
  if (compressionLevel != 0) {
    compressionLevel_00 = compressionLevel;
  }
  ZSTD_CCtxParams_init_internal(&cctxParams,&params,compressionLevel_00);
  sVar1 = ZSTD_compressBegin_internal
                    (cctx,dict,dictSize,ZSTD_dct_auto,ZSTD_dtlm_fast,(ZSTD_CDict *)0x0,&cctxParams,
                     0xffffffffffffffff,ZSTDb_not_buffered);
  return sVar1;
}

Assistant:

static size_t
ZSTD_compressBegin_usingDict_deprecated(ZSTD_CCtx* cctx, const void* dict, size_t dictSize, int compressionLevel)
{
    ZSTD_CCtx_params cctxParams;
    {   ZSTD_parameters const params = ZSTD_getParams_internal(compressionLevel, ZSTD_CONTENTSIZE_UNKNOWN, dictSize, ZSTD_cpm_noAttachDict);
        ZSTD_CCtxParams_init_internal(&cctxParams, &params, (compressionLevel == 0) ? ZSTD_CLEVEL_DEFAULT : compressionLevel);
    }
    DEBUGLOG(4, "ZSTD_compressBegin_usingDict (dictSize=%u)", (unsigned)dictSize);
    return ZSTD_compressBegin_internal(cctx, dict, dictSize, ZSTD_dct_auto, ZSTD_dtlm_fast, NULL,
                                       &cctxParams, ZSTD_CONTENTSIZE_UNKNOWN, ZSTDb_not_buffered);
}